

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.hh
# Opt level: O2

optional<tinyusdz::value::quath> * __thiscall
tinyusdz::XformOp::get_value<tinyusdz::value::quath>
          (optional<tinyusdz::value::quath> *__return_storage_ptr__,XformOp *this,double t,
          TimeSampleInterpolationType interp)

{
  storage_t<tinyusdz::value::quath> sVar1;
  bool bVar2;
  storage_t<tinyusdz::value::quath> sVar3;
  PrimVar *this_00;
  quath value;
  optional<tinyusdz::value::quath> local_38;
  double local_28;
  
  this_00 = &this->_var;
  local_28 = t;
  bVar2 = primvar::PrimVar::is_timesamples(this_00);
  if (bVar2) {
    bVar2 = primvar::PrimVar::get_interpolated_value<tinyusdz::value::quath>
                      (this_00,local_28,interp,(quath *)&local_38);
    if (bVar2) {
      sVar3._1_1_ = local_38._1_1_;
      sVar3._0_1_ = local_38.has_value_;
      sVar3._2_6_ = local_38.contained._0_6_;
    }
    else {
      sVar3 = (storage_t<tinyusdz::value::quath>)0x0;
    }
    __return_storage_ptr__->has_value_ = bVar2;
    __return_storage_ptr__->contained = sVar3;
  }
  else {
    primvar::PrimVar::get_value<tinyusdz::value::quath>(&local_38,this_00);
    __return_storage_ptr__->has_value_ = local_38.has_value_;
    if (local_38.has_value_ == true) {
      sVar1._6_2_ = local_38.contained._6_2_;
      sVar1._0_6_ = local_38.contained._0_6_;
      __return_storage_ptr__->contained = sVar1;
    }
  }
  return __return_storage_ptr__;
}

Assistant:

nonstd::optional<T> get_value(double t = value::TimeCode::Default(), 
          value::TimeSampleInterpolationType interp =
               value::TimeSampleInterpolationType::Linear) const {
    if (is_timesamples()) {
      T value;
      if (get_interpolated_value(&value, t, interp)) {
        return value;
      }
      return nonstd::nullopt;
    }

    return _var.get_value<T>();
  }